

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O2

verifier<jwt::default_clock> * __thiscall
jwt::verifier<jwt::default_clock>::allow_algorithm<jwt::algorithm::rs256>
          (verifier<jwt::default_clock> *this,rs256 *alg)

{
  __shared_ptr<jwt::verifier<jwt::default_clock>::algo_base,(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_ptr<jwt::verifier<jwt::default_clock>::algo<jwt::algorithm::rs256>,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  key_type local_30;
  
  std::
  make_shared<jwt::verifier<jwt::default_clock>::algo<jwt::algorithm::rs256>,jwt::algorithm::rs256&>
            ((rs256 *)&local_40);
  std::__cxx11::string::string((string *)&local_30,(string *)&(alg->super_rsa).alg_name);
  this_00 = (__shared_ptr<jwt::verifier<jwt::default_clock>::algo_base,(__gnu_cxx::_Lock_policy)2> *
            )std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->algs,&local_30);
  std::__shared_ptr<jwt::verifier<jwt::default_clock>::algo_base,(__gnu_cxx::_Lock_policy)2>::
  operator=(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return this;
}

Assistant:

verifier& allow_algorithm(Algorithm alg) {
			algs[alg.name()] = std::make_shared<algo<Algorithm>>(alg);
			return *this;
		}